

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O3

void __thiscall ExecutionEngine::i_dload_0(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *this_01;
  Value VVar1;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar1 = Frame::getLocalVariableValue(this_01,1);
  if (VVar1.type != PADDING) {
    __assert_fail("value.type == ValueType::PADDING",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x329,"void ExecutionEngine::i_dload_0()");
  }
  Frame::pushIntoOperandStack(this_01,VVar1);
  VVar1 = Frame::getLocalVariableValue(this_01,0);
  if ((VVar1._0_8_ & 0xffffffff00000000) == 0x700000000) {
    Frame::pushIntoOperandStack(this_01,VVar1);
    this_01->pc = this_01->pc + 1;
    return;
  }
  __assert_fail("value.type == ValueType::DOUBLE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x32d,"void ExecutionEngine::i_dload_0()");
}

Assistant:

void ExecutionEngine::i_dload_0() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();

    Value value;

    value = topFrame->getLocalVariableValue(1);
    assert(value.type == ValueType::PADDING);
    topFrame->pushIntoOperandStack(value);

    value = topFrame->getLocalVariableValue(0);
    assert(value.type == ValueType::DOUBLE);
    topFrame->pushIntoOperandStack(value);

    topFrame->pc += 1;
}